

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O2

void ggml_vec_dot_iq1_m_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  auVar9 = vpmovsxbq_avx512vl(ZEXT416(0x9030600));
  auVar10 = vpbroadcastw_avx512vl(ZEXT216(1));
  auVar11 = vpbroadcastw_avx512vl(ZEXT216(0xe));
  auVar14._8_2_ = 0x100;
  auVar14._0_8_ = 0x100010001000100;
  auVar14._10_2_ = 0x100;
  auVar14._12_2_ = 0x100;
  auVar14._14_2_ = 0x100;
  auVar14._16_2_ = 0x100;
  auVar14._18_2_ = 0x100;
  auVar14._20_2_ = 0x100;
  auVar14._22_2_ = 0x100;
  auVar14._24_2_ = 0x100;
  auVar14._26_2_ = 0x100;
  auVar14._28_2_ = 0x100;
  auVar14._30_2_ = 0x100;
  auVar15._8_2_ = 0x908;
  auVar15._0_8_ = 0x908090809080908;
  auVar15._10_2_ = 0x908;
  auVar15._12_2_ = 0x908;
  auVar15._14_2_ = 0x908;
  auVar15._16_2_ = 0x908;
  auVar15._18_2_ = 0x908;
  auVar15._20_2_ = 0x908;
  auVar15._22_2_ = 0x908;
  auVar15._24_2_ = 0x908;
  auVar15._26_2_ = 0x908;
  auVar15._28_2_ = 0x908;
  auVar15._30_2_ = 0x908;
  auVar16[8] = 1;
  auVar16._0_8_ = 0x101010101010101;
  auVar16[9] = 1;
  auVar16[10] = 1;
  auVar16[0xb] = 1;
  auVar16[0xc] = 1;
  auVar16[0xd] = 1;
  auVar16[0xe] = 1;
  auVar16[0xf] = 1;
  auVar16[0x10] = 1;
  auVar16[0x11] = 1;
  auVar16[0x12] = 1;
  auVar16[0x13] = 1;
  auVar16[0x14] = 1;
  auVar16[0x15] = 1;
  auVar16[0x16] = 1;
  auVar16[0x17] = 1;
  auVar16[0x18] = 1;
  auVar16[0x19] = 1;
  auVar16[0x1a] = 1;
  auVar16[0x1b] = 1;
  auVar16[0x1c] = 1;
  auVar16[0x1d] = 1;
  auVar16[0x1e] = 1;
  auVar16[0x1f] = 1;
  auVar17[8] = 2;
  auVar17._0_8_ = 0x202020202020202;
  auVar17[9] = 2;
  auVar17[10] = 2;
  auVar17[0xb] = 2;
  auVar17[0xc] = 2;
  auVar17[0xd] = 2;
  auVar17[0xe] = 2;
  auVar17[0xf] = 2;
  auVar17[0x10] = 2;
  auVar17[0x11] = 2;
  auVar17[0x12] = 2;
  auVar17[0x13] = 2;
  auVar17[0x14] = 2;
  auVar17[0x15] = 2;
  auVar17[0x16] = 2;
  auVar17[0x17] = 2;
  auVar17[0x18] = 2;
  auVar17[0x19] = 2;
  auVar17[0x1a] = 2;
  auVar17[0x1b] = 2;
  auVar17[0x1c] = 2;
  auVar17[0x1d] = 2;
  auVar17[0x1e] = 2;
  auVar17[0x1f] = 2;
  if ((~(n / 0x100 >> 0x1f) & n / 0x100) != 0) {
    uVar1 = *(undefined8 *)((long)vx + 0x30);
    auVar12._8_8_ = uVar1;
    auVar12._0_8_ = uVar1;
    auVar12._16_8_ = uVar1;
    auVar12._24_8_ = uVar1;
    auVar9 = vpsrlvq_avx512vl(auVar12,auVar9);
    auVar9 = vpaddw_avx2(auVar9,auVar9);
    auVar9 = vpternlogq_avx512vl(auVar9,auVar10,auVar11,0xec);
    uVar3 = (ulong)*vx;
    uVar6 = (ulong)*(uint *)((long)vx + 4);
    uVar5 = (ulong)(*(ushort *)((long)vx + 0x20) & 0x7777);
    uVar2 = 1;
    uVar4 = 0;
    do {
      if ((uVar2 & 0xff00ff00ff00ff) != 0) {
        uVar4 = uVar4 | (uVar2 & 0xff00ff00ff00ff) * (uVar3 & 1);
        uVar3 = uVar3 >> 1;
      }
      uVar2 = uVar2 << 1;
    } while (uVar2 != 0);
    uVar3 = 1;
    uVar2 = 0;
    do {
      if ((uVar3 & 0xff00ff00ff00ff) != 0) {
        uVar2 = uVar2 | (uVar3 & 0xff00ff00ff00ff) * (uVar6 & 1);
        uVar6 = uVar6 >> 1;
      }
      uVar3 = uVar3 << 1;
    } while (uVar3 != 0);
    uVar3 = 1;
    uVar6 = 0;
    do {
      if ((uVar3 & 0xf000f000f000f00) != 0) {
        uVar6 = uVar6 | (uVar3 & 0xf000f000f000f00) * (uVar5 & 1);
        uVar5 = uVar5 >> 1;
      }
      uVar3 = uVar3 << 1;
    } while (uVar3 != 0);
    uVar6 = uVar6 | uVar4;
    uVar3 = (ulong)(*(ushort *)((long)vx + 0x22) & 0x7777);
    uVar5 = 1;
    uVar4 = 0;
    do {
      if ((uVar5 & 0xf000f000f000f00) != 0) {
        uVar4 = uVar4 | (uVar5 & 0xf000f000f000f00) * (uVar3 & 1);
        uVar3 = uVar3 >> 1;
      }
      uVar5 = uVar5 << 1;
    } while (uVar5 != 0);
    uVar4 = uVar4 | uVar2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = iq1s_grid[uVar6 >> 0x30];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = iq1s_grid[(uint)(uVar6 >> 0x20) & 0xffff];
    auVar8 = vpunpcklqdq_avx(auVar18,auVar8);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = iq1s_grid[uVar6 >> 0x10 & 0xffff];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = iq1s_grid[(uint)uVar6 & 0xffff];
    auVar7 = vpunpcklqdq_avx512vl(auVar20,auVar19);
    uVar3 = (ulong)(*(uint *)((long)vx + 0x20) & 0x88888888);
    auVar10._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar7;
    auVar10._16_16_ = ZEXT116(1) * auVar8;
    uVar6 = 1;
    uVar5 = 0;
    do {
      if ((uVar6 & 0xf0f0f0f0f0f0f0f0) != 0) {
        uVar5 = uVar5 | (uVar6 & 0xf0f0f0f0f0f0f0f0) * (uVar3 & 1);
        uVar3 = uVar3 >> 1;
      }
      uVar6 = uVar6 << 1;
    } while (uVar6 != 0);
    auVar11 = vpsignb_avx2(auVar10,auVar10);
    auVar10 = vpsignb_avx2(*(undefined1 (*) [32])((long)vy + 4),auVar10);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = iq1s_grid[uVar4 >> 0x30];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = iq1s_grid[(uint)(uVar4 >> 0x20) & 0xffff];
    auVar8 = vpunpcklqdq_avx512vl(auVar22,auVar21);
    vpmaddubsw_avx2(auVar11,auVar10);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = iq1s_grid[uVar4 >> 0x10 & 0xffff];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = iq1s_grid[(uint)uVar4 & 0xffff];
    auVar7 = vpunpcklqdq_avx512vl(auVar24,auVar23);
    auVar11 = vinserti32x4_avx512vl(ZEXT1632(auVar7),auVar8,1);
    auVar12 = vpmovsxbq_avx512vl(ZEXT416((uint)uVar5));
    auVar10 = vpsignb_avx2(auVar11,auVar11);
    auVar11 = vpsignb_avx2(*(undefined1 (*) [32])((long)vy + 0x24),auVar11);
    vpmaddubsw_avx2(auVar10,auVar11);
    auVar11 = vpmovsxbq_avx512vl(ZEXT416((uint)(uVar5 >> 0x20)));
    auVar10 = vporq_avx512vl(auVar12,auVar16);
    vpshufb_avx512vl(auVar9,auVar15);
    vpaddb_avx2(auVar15,auVar17);
    auVar10 = vpsignb_avx2(*(undefined1 (*) [32])((long)vy + 4),auVar10);
    auVar11 = vporq_avx512vl(auVar11,auVar16);
    vpmaddubsw_avx2(auVar16,auVar10);
    auVar10 = vpsignb_avx2(*(undefined1 (*) [32])((long)vy + 0x24),auVar11);
    vpshufb_avx2(auVar9,auVar14);
    vpaddb_avx2(auVar14,auVar17);
    vpmaddubsw_avx2(auVar16,auVar10);
    halt_baddata();
  }
  auVar8 = vshufpd_avx(ZEXT816(0) << 0x40,ZEXT816(0) << 0x40,1);
  auVar7._0_4_ = auVar8._0_4_ + 0.0;
  auVar7._4_4_ = auVar8._4_4_ + 0.0;
  auVar7._8_4_ = auVar8._8_4_ + 0.0;
  auVar7._12_4_ = auVar8._12_4_ + 0.0;
  auVar8 = vhaddps_avx(auVar7,auVar7);
  auVar7 = vshufpd_avx(ZEXT816(0) << 0x40,ZEXT816(0) << 0x40,1);
  auVar13._0_4_ = auVar7._0_4_ + 0.0;
  auVar13._4_4_ = auVar7._4_4_ + 0.0;
  auVar13._8_4_ = auVar7._8_4_ + 0.0;
  auVar13._12_4_ = auVar7._12_4_ + 0.0;
  auVar7 = vhaddps_avx(auVar13,auVar13);
  auVar8 = vfmadd132ss_fma(auVar7,auVar8,ZEXT416(0x3e000000));
  *s = auVar8._0_4_;
  return;
}

Assistant:

void ggml_vec_dot_iq1_m_q8_K  (int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(n % QK_K == 0);
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_iq1_m * GGML_RESTRICT x = vx;
    const block_q8_K  * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

    iq1m_scale_t scale;

#if defined __ARM_NEON
    const int32x4_t mask  = vdupq_n_s32(0x7);
    const int32x4_t mone  = vdupq_n_s32(1);
    const int32x4_t mzero = vdupq_n_s32(0);

    ggml_int8x16x4_t deltas;
    deltas.val[0] = vcombine_s8(vdup_n_s8(+1), vdup_n_s8(+1));
    deltas.val[1] = vcombine_s8(vdup_n_s8(-1), vdup_n_s8(+1));
    deltas.val[2] = vcombine_s8(vdup_n_s8(+1), vdup_n_s8(-1));
    deltas.val[3] = vcombine_s8(vdup_n_s8(-1), vdup_n_s8(-1));

    ggml_int8x16x4_t q1b;
    ggml_int8x16x4_t q8b;

    uint32_t aux32;
    const uint8_t * aux8 = (const uint8_t *)&aux32;

    float sumf = 0;
    for (int i = 0; i < nb; ++i) {

        const int8_t   * q8 = y[i].qs;
        const uint8_t  * qs = x[i].qs;
        const uint8_t  * qh = x[i].qh;
        const uint16_t * sc = (const uint16_t *)x[i].scales;

        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);

        int32x4_t sumi1 = mzero;
        int32x4_t sumi2 = mzero;

        for (int ib = 0; ib < QK_K/32; ib += 2) {

            q1b.val[0] = vcombine_s8(vld1_s8((const int8_t *)(iq1s_grid + (qs[0] | ((qh[0] << 8) & 0x700)))),
                                     vld1_s8((const int8_t *)(iq1s_grid + (qs[1] | ((qh[0] << 4) & 0x700)))));
            q1b.val[1] = vcombine_s8(vld1_s8((const int8_t *)(iq1s_grid + (qs[2] | ((qh[1] << 8) & 0x700)))),
                                     vld1_s8((const int8_t *)(iq1s_grid + (qs[3] | ((qh[1] << 4) & 0x700)))));
            q1b.val[2] = vcombine_s8(vld1_s8((const int8_t *)(iq1s_grid + (qs[4] | ((qh[2] << 8) & 0x700)))),
                                     vld1_s8((const int8_t *)(iq1s_grid + (qs[5] | ((qh[2] << 4) & 0x700)))));
            q1b.val[3] = vcombine_s8(vld1_s8((const int8_t *)(iq1s_grid + (qs[6] | ((qh[3] << 8) & 0x700)))),
                                     vld1_s8((const int8_t *)(iq1s_grid + (qs[7] | ((qh[3] << 4) & 0x700)))));

            q8b = ggml_vld1q_s8_x4(q8); q8 += 64;

            const int32x4_t p1 = vpaddq_s32(ggml_vdotq_s32(mzero, q1b.val[0], q8b.val[0]), ggml_vdotq_s32(mzero, q1b.val[1], q8b.val[1]));
            const int32x4_t p2 = vpaddq_s32(ggml_vdotq_s32(mzero, q1b.val[2], q8b.val[2]), ggml_vdotq_s32(mzero, q1b.val[3], q8b.val[3]));
            const int32x4_t p12 = vpaddq_s32(p1, p2);

            const uint32_t * qh32 = (const uint32_t *)qh; // we are 4-byte aligned, so we can do that
            aux32 = ((qh32[0] >> 3) & 0x01010101) | ((qh32[0] >> 6) & 0x02020202);

            const int32x4_t p3 = vpaddq_s32(ggml_vdotq_s32(mzero, deltas.val[aux8[0]], q8b.val[0]), ggml_vdotq_s32(mzero, deltas.val[aux8[1]], q8b.val[1]));
            const int32x4_t p4 = vpaddq_s32(ggml_vdotq_s32(mzero, deltas.val[aux8[2]], q8b.val[2]), ggml_vdotq_s32(mzero, deltas.val[aux8[3]], q8b.val[3]));
            const int32x4_t p34 = vpaddq_s32(p3, p4);

            int32x4_t scales_4 = ggml_vld1q_u32(sc[ib/2] >> 0, sc[ib/2] >> 3, sc[ib/2] >> 6, sc[ib/2] >> 9);

            scales_4 = vaddq_s32(vshlq_n_s32(vandq_s32(scales_4, mask), 1), mone);

            sumi1 = vmlaq_s32(sumi1, scales_4, p12);
            sumi2 = vmlaq_s32(sumi2, scales_4, p34);

            qs += 8; qh += 4;

        }

        sumf += y[i].d * GGML_FP16_TO_FP32(scale.f16) * (vaddvq_s32(sumi1) + IQ1M_DELTA * vaddvq_s32(sumi2));
    }

    *s = sumf;

#elif defined __AVX2__

    const __m256i mask = _mm256_set1_epi16(0x7);
    const __m256i mone = _mm256_set1_epi16(1);
    const __m256i mone8 = _mm256_set1_epi8(1);
    const __m256i mtwo8 = _mm256_set1_epi8(2);
    // VPSHUFB cannot cross 128-bit lanes so odd shifts go to upper half.
    const __m256i scales_shift = _mm256_set_epi64x(9, 3, 6, 0);

    __m256 accum1 = _mm256_setzero_ps();
    __m256 accum2 = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {

        const int8_t   * q8 = y[i].qs;
        const uint8_t  * qs = x[i].qs;
        const uint8_t  * qh = x[i].qh;
        const uint16_t * sc = (const uint16_t *)x[i].scales;

        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);
        // Extract 3-bit scales (16 values)
        __m256i scales = _mm256_set1_epi64x(*(const uint64_t*)sc);
        scales = _mm256_srlv_epi64(scales, scales_shift);
        scales = _mm256_add_epi16(_mm256_slli_epi16(_mm256_and_si256(scales, mask), 1), mone);

        // Indices to repeat each scale 8 times.
        __m256i scales_idx1 = _mm256_set1_epi16(0x0100);
        __m256i scales_idx2 = _mm256_add_epi8(scales_idx1, _mm256_set1_epi8(8));

        __m256i sumi1 = _mm256_setzero_si256();
        __m256i sumi2 = _mm256_setzero_si256();
        for (int ib = 0; ib < QK_K/32; ib += 2) {
#ifdef __BMI2__
            const uint64_t packed_idx1 = _pdep_u64(*(const uint32_t *)qs, 0x00ff00ff00ff00ffULL)
                                       | _pdep_u64(*(const uint16_t*)(qh) & 0x7777, 0xf000f000f000f00ULL);
            const uint64_t packed_idx2 = _pdep_u64(*(const uint32_t *)(qs + 4), 0x00ff00ff00ff00ffULL)
                                       | _pdep_u64(*(const uint16_t*)(qh + 2) & 0x7777, 0xf000f000f000f00ULL);
            const uint16_t *idx1 = (const uint16_t *)(&packed_idx1);
            const uint16_t *idx2 = (const uint16_t *)(&packed_idx2);
            const __m256i q1b_1 = _mm256_set_epi64x(iq1s_grid[idx1[3]], iq1s_grid[idx1[2]], iq1s_grid[idx1[1]], iq1s_grid[idx1[0]]);
            const __m256i q1b_2 = _mm256_set_epi64x(iq1s_grid[idx2[3]], iq1s_grid[idx2[2]], iq1s_grid[idx2[1]], iq1s_grid[idx2[0]]);

            // Convert signs to bytes 0x81 (negative) or 0x01 (positive)
            const uint64_t delta_sign = _pdep_u64(*(const uint32_t*)(qh) & 0x88888888, 0xf0f0f0f0f0f0f0f0ULL);
            const __m256i delta1 = _mm256_or_si256(mone8, _mm256_cvtepi8_epi64(_mm_set1_epi32(delta_sign)));
            const __m256i delta2 = _mm256_or_si256(mone8, _mm256_cvtepi8_epi64(_mm_set1_epi32(delta_sign >> 32)));
#else
            const __m256i q1b_1 = _mm256_set_epi64x(
                    iq1s_grid[qs[3] | (((uint16_t)qh[1] << 4) & 0x700)], iq1s_grid[qs[2] | (((uint16_t)qh[1] << 8) & 0x700)],
                    iq1s_grid[qs[1] | (((uint16_t)qh[0] << 4) & 0x700)], iq1s_grid[qs[0] | (((uint16_t)qh[0] << 8) & 0x700)]
            );
            const __m256i q1b_2 = _mm256_set_epi64x(
                    iq1s_grid[qs[7] | (((uint16_t)qh[3] << 4) & 0x700)], iq1s_grid[qs[6] | (((uint16_t)qh[3] << 8) & 0x700)],
                    iq1s_grid[qs[5] | (((uint16_t)qh[2] << 4) & 0x700)], iq1s_grid[qs[4] | (((uint16_t)qh[2] << 8) & 0x700)]
            );

            const __m256i delta1 = _mm256_set_epi64x(qh[1] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[1] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[0] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[0] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
            const __m256i delta2 = _mm256_set_epi64x(qh[3] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[3] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[2] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[2] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
#endif
            const __m256i q8b_1 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;
            const __m256i q8b_2 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;

            const __m256i dot1 = mul_add_epi8(q1b_1, q8b_1);
            const __m256i dot2 = mul_add_epi8(q1b_2, q8b_2);
            const __m256i dot3 = _mm256_maddubs_epi16(mone8, _mm256_sign_epi8(q8b_1, delta1));
            const __m256i dot4 = _mm256_maddubs_epi16(mone8, _mm256_sign_epi8(q8b_2, delta2));

            __m256i scale1 = _mm256_shuffle_epi8(scales, scales_idx1);
            __m256i scale2 = _mm256_shuffle_epi8(scales, scales_idx2);

            scales_idx1 = _mm256_add_epi8(scales_idx1, mtwo8);
            scales_idx2 = _mm256_add_epi8(scales_idx2, mtwo8);

            const __m256i p1 = _mm256_madd_epi16(dot1, scale1);
            const __m256i p2 = _mm256_madd_epi16(dot2, scale2);
            const __m256i p3 = _mm256_madd_epi16(dot3, scale1);
            const __m256i p4 = _mm256_madd_epi16(dot4, scale2);

            sumi1 = _mm256_add_epi32(sumi1, _mm256_add_epi32(p1, p2));
            sumi2 = _mm256_add_epi32(sumi2, _mm256_add_epi32(p3, p4));

            qs += 8; qh += 4;
        }

        const __m256 d = _mm256_set1_ps(y[i].d * GGML_FP16_TO_FP32(scale.f16));

        accum1 = _mm256_fmadd_ps(d, _mm256_cvtepi32_ps(sumi1), accum1);
        accum2 = _mm256_fmadd_ps(d, _mm256_cvtepi32_ps(sumi2), accum2);
    }

    *s = hsum_float_8(accum1) + IQ1M_DELTA * hsum_float_8(accum2);

#elif defined __AVX__
    const __m128i mask = _mm_set1_epi16(0x7);
    const __m128i mone = _mm_set1_epi16(1);

    __m256 accum1 = _mm256_setzero_ps();
    __m256 accum2 = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {

        const int8_t   * q8 = y[i].qs;
        const uint8_t  * qs = x[i].qs;
        const uint8_t  * qh = x[i].qh;
        const uint16_t * sc = (const uint16_t *)x[i].scales;

        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);

        __m128i sumi1_0 = _mm_setzero_si128();
        __m128i sumi1_1 = _mm_setzero_si128();
        __m128i sumi2_0 = _mm_setzero_si128();
        __m128i sumi2_1 = _mm_setzero_si128();
        for (int ib = 0; ib < QK_K/32; ib += 2) {
            const __m128i q1b_1_0 = _mm_set_epi64x(
                    iq1s_grid[qs[1] | (((uint16_t)qh[0] << 4) & 0x700)], iq1s_grid[qs[0] | (((uint16_t)qh[0] << 8) & 0x700)]);
            const __m128i q1b_1_1 = _mm_set_epi64x(
                    iq1s_grid[qs[3] | (((uint16_t)qh[1] << 4) & 0x700)], iq1s_grid[qs[2] | (((uint16_t)qh[1] << 8) & 0x700)]);
            const __m128i q1b_2_0 = _mm_set_epi64x(
                    iq1s_grid[qs[5] | (((uint16_t)qh[2] << 4) & 0x700)], iq1s_grid[qs[4] | (((uint16_t)qh[2] << 8) & 0x700)]);
            const __m128i q1b_2_1 = _mm_set_epi64x(
                    iq1s_grid[qs[7] | (((uint16_t)qh[3] << 4) & 0x700)], iq1s_grid[qs[6] | (((uint16_t)qh[3] << 8) & 0x700)]);
            const __m128i q8b_1_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8b_1_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8b_2_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8b_2_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;

            const __m128i dot1_0 = mul_add_epi8_sse(q1b_1_0, q8b_1_0);
            const __m128i dot1_1 = mul_add_epi8_sse(q1b_1_1, q8b_1_1);
            const __m128i dot2_0 = mul_add_epi8_sse(q1b_2_0, q8b_2_0);
            const __m128i dot2_1 = mul_add_epi8_sse(q1b_2_1, q8b_2_1);

            const __m128i delta1_0 = _mm_set_epi64x(qh[0] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[0] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
            const __m128i delta1_1 = _mm_set_epi64x(qh[1] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[1] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
            const __m128i delta2_0 = _mm_set_epi64x(qh[2] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[2] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
            const __m128i delta2_1 = _mm_set_epi64x(qh[3] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[3] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);

            const __m128i dot3_0 = mul_add_epi8_sse(delta1_0, q8b_1_0);
            const __m128i dot3_1 = mul_add_epi8_sse(delta1_1, q8b_1_1);
            const __m128i dot4_0 = mul_add_epi8_sse(delta2_0, q8b_2_0);
            const __m128i dot4_1 = mul_add_epi8_sse(delta2_1, q8b_2_1);

            __m128i scale1_0 = _mm_set1_epi16(sc[ib/2] >> 0);
            __m128i scale1_1 = _mm_set1_epi16(sc[ib/2] >> 3);
            __m128i scale2_0 = _mm_set1_epi16(sc[ib/2] >> 6);
            __m128i scale2_1 = _mm_set1_epi16(sc[ib/2] >> 9);

            scale1_0 = _mm_add_epi16(_mm_slli_epi16(_mm_and_si128(scale1_0, mask), 1), mone);
            scale1_1 = _mm_add_epi16(_mm_slli_epi16(_mm_and_si128(scale1_1, mask), 1), mone);
            scale2_0 = _mm_add_epi16(_mm_slli_epi16(_mm_and_si128(scale2_0, mask), 1), mone);
            scale2_1 = _mm_add_epi16(_mm_slli_epi16(_mm_and_si128(scale2_1, mask), 1), mone);
            const __m128i p1_0 = _mm_madd_epi16(dot1_0, scale1_0);
            const __m128i p1_1 = _mm_madd_epi16(dot1_1, scale1_1);
            const __m128i p2_0 = _mm_madd_epi16(dot2_0, scale2_0);
            const __m128i p2_1 = _mm_madd_epi16(dot2_1, scale2_1);
            const __m128i p3_0 = _mm_madd_epi16(dot3_0, scale1_0);
            const __m128i p3_1 = _mm_madd_epi16(dot3_1, scale1_1);
            const __m128i p4_0 = _mm_madd_epi16(dot4_0, scale2_0);
            const __m128i p4_1 = _mm_madd_epi16(dot4_1, scale2_1);

            sumi1_0 = _mm_add_epi32(sumi1_0, _mm_add_epi32(p1_0, p2_0));
            sumi1_1 = _mm_add_epi32(sumi1_1, _mm_add_epi32(p1_1, p2_1));
            sumi2_0 = _mm_add_epi32(sumi2_0, _mm_add_epi32(p3_0, p4_0));
            sumi2_1 = _mm_add_epi32(sumi2_1, _mm_add_epi32(p3_1, p4_1));

            qs += 8; qh += 4;
        }

        const __m256 d = _mm256_set1_ps(y[i].d * GGML_FP16_TO_FP32(scale.f16));

        accum1 = _mm256_add_ps(_mm256_mul_ps(d, _mm256_cvtepi32_ps(MM256_SET_M128I(sumi1_1, sumi1_0))), accum1);
        accum2 = _mm256_add_ps(_mm256_mul_ps(d, _mm256_cvtepi32_ps(MM256_SET_M128I(sumi2_1, sumi2_0))), accum2);
    }

    *s = hsum_float_8(accum1) + IQ1M_DELTA * hsum_float_8(accum2);

#else

    int sum1[2], sum2[2], delta[4];

    float sumf = 0;
    for (int i = 0; i < nb; i++) {

        const int8_t   * q8 = y[i].qs;
        const uint8_t  * qs = x[i].qs;
        const uint8_t  * qh = x[i].qh;
        const uint16_t * sc = (const uint16_t *)x[i].scales;

        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);

        int sumi1 = 0, sumi2 = 0;
        for (int ib = 0; ib < QK_K/32; ++ib) {
            delta[0] = qh[0] & 0x08 ? -1 : 1;
            delta[1] = qh[0] & 0x80 ? -1 : 1;
            delta[2] = qh[1] & 0x08 ? -1 : 1;
            delta[3] = qh[1] & 0x80 ? -1 : 1;
            sum1[0] = sum1[1] = sum2[0] = sum2[1] = 0;
            for (int l = 0; l < 4; ++l) {
                const int8_t * grid = (const int8_t *)(iq1s_grid + (qs[l] | (((uint16_t)qh[l/2] << (8 - 4*(l%2))) & 0x700)));
                int lsum1 = 0, lsum2 = 0;
                for (int j = 0; j < 8; ++j) {
                    lsum1 += q8[j] * grid[j];
                    lsum2 += q8[j];
                }
                q8 += 8;
                sum1[l/2] += lsum1;
                sum2[l/2] += lsum2*delta[l];
            }

            const int ls1 = 2*((sc[ib/2] >> (6*(ib%2)+0)) & 0x7) + 1;
            const int ls2 = 2*((sc[ib/2] >> (6*(ib%2)+3)) & 0x7) + 1;

            sumi1 += sum1[0] * ls1 + sum1[1] * ls2;
            sumi2 += sum2[0] * ls1 + sum2[1] * ls2;
            qs += 4;
            qh += 2;
        }

        sumf += GGML_FP16_TO_FP32(scale.f16) * y[i].d * (sumi1 + IQ1M_DELTA * sumi2);
    }

    *s = sumf;

#endif
}